

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

void shuff_decompress(uint32_t *out_u32,size_t to_decode,uint8_t *in_u8,size_t cSrcSize)

{
  uint64_t uVar1;
  uint64_t *A;
  ulong *puVar2;
  ulong uVar3;
  ulong *puVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t *puVar9;
  ulong *puVar10;
  ulong uVar11;
  long lVar12;
  uint64_t *puVar13;
  uint64_t cw_lens [64];
  bit_io_t local_270;
  uint64_t local_248;
  ulong local_240;
  uint64_t local_238 [65];
  
  local_270.bytes_written = 0;
  local_270.buff_btg = 0x40;
  local_270.in_u64 = (uint64_t *)in_u8;
  A = (uint64_t *)shuff_allocate(0x40000000);
  local_240 = *(ulong *)in_u8;
  uVar5 = local_240 >> 0x25;
  local_270.buff_btg = 0x25;
  uVar7 = (ulong)((uint)(local_240 >> 0x25) * 8);
  puVar2 = (ulong *)shuff_allocate(uVar7 + 1);
  uVar3 = *local_270.in_u64 >> 0x1f & 0x3f;
  local_270.buff_btg = 0x1f;
  memset(local_238,0,(*local_270.in_u64 >> 0x1f & 0x3f) * 8 + 8);
  puVar10 = (ulong *)(uVar7 + (long)puVar2);
  if (uVar5 != 0) {
    uVar7 = uVar3 + 1;
    puVar4 = puVar2;
    do {
      do {
        uVar8 = local_270.buff_btg - 1;
        uVar11 = *local_270.in_u64;
        local_270.buff_btg = uVar8;
        if (uVar8 == 0) {
          local_270.in_u64 = local_270.in_u64 + 1;
          local_270.buff_btg = 0x40;
        }
        uVar7 = uVar7 - 1;
      } while ((uVar11 >> (uVar8 & 0x3f) & 1) == 0);
      *puVar4 = uVar7;
      local_238[uVar7] = local_238[uVar7] + 1;
      puVar4 = puVar4 + 1;
      uVar7 = uVar3 + 1;
    } while (puVar4 < puVar10);
  }
  uVar7 = 0xffffffffffffffff;
  do {
    lVar12 = uVar7 + 1;
    uVar7 = uVar7 + 1;
  } while (local_238[lVar12] == 0);
  local_248 = uVar5;
  shuff_build_canonical_arrays(local_238,uVar3);
  shuff_interp_decode(&local_270,A,local_248);
  puVar4 = puVar10;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      local_238[0] = local_238[0] + local_238[uVar5 + 1];
      local_238[uVar5 + 1] = local_238[0];
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  while (puVar4 = puVar4 + -1, puVar2 <= puVar4) {
    uVar5 = (&local_240)[*puVar4];
    (&local_240)[*puVar4] = uVar5 + 1;
    *puVar4 = uVar5;
  }
  *puVar10 = 1;
  if (0x1fffffffff < local_240) {
    uVar5 = 0;
    do {
      uVar11 = puVar2[uVar5];
      if (-1 < (long)uVar11) {
        uVar6 = A[uVar5];
        uVar8 = uVar5;
        do {
          puVar2[uVar8] = 0xffffffffffffffff;
          uVar8 = (ulong)(int)uVar11;
          uVar1 = A[uVar8];
          A[uVar8] = uVar6;
          uVar11 = puVar2[uVar8];
          uVar6 = uVar1;
        } while (-1 < (long)uVar11);
      }
      uVar5 = uVar5 - 1;
      do {
        lVar12 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while (puVar2[lVar12] == 0xffffffffffffffff);
    } while (uVar5 < local_248);
  }
  free(puVar2);
  shuff_build_lut(uVar3);
  if (to_decode != 0) {
    uVar3 = 8;
    if (8 < uVar7) {
      uVar3 = uVar7;
    }
    uVar7 = 0;
    uVar5 = 0x40;
    uVar6 = local_270.buff_btg;
    do {
      if (uVar5 == 0) {
        uVar11 = 0;
        local_270.buff_btg = uVar6;
      }
      else {
        uVar11 = (*local_270.in_u64 << ((ulong)(byte)-(char)uVar6 & 0x3f)) >>
                 ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_270.buff_btg = uVar6 - uVar5;
        if (uVar6 < uVar5 || local_270.buff_btg == 0) {
          lVar12 = uVar5 - uVar6;
          local_270.in_u64 = local_270.in_u64 + 1;
          local_270.buff_btg = 0x40;
          if (0 < lVar12) {
            local_270.buff_btg = 0x40 - lVar12;
            uVar11 = uVar11 | *local_270.in_u64 >> (-lVar12 & 0x3fU);
          }
        }
        local_270.in_u64 = local_270.in_u64 + (local_270.buff_btg == 0);
        if (local_270.buff_btg == 0) {
          local_270.buff_btg = 0x40;
        }
      }
      uVar11 = uVar11 | uVar7;
      puVar9 = shuff_lut[uVar11 >> 0x38];
      puVar13 = (uint64_t *)(uVar3 * 8 + 0x14e6f0);
      if (puVar9 == (uint64_t *)0x0) {
        do {
          puVar9 = puVar13 + 1;
          puVar2 = puVar13 + 1;
          puVar13 = puVar9;
        } while (uVar11 < *puVar2);
      }
      uVar5 = ((long)(puVar9 + -0x29ce0) >> 3) + 1;
      *out_u32 = (int)A[((uVar11 >> ((ulong)(byte)~(byte)((long)(puVar9 + -0x29ce0) >> 3) & 0x3f)) -
                        puVar9[-0x40]) + puVar9[0x40]] - 1;
      out_u32 = out_u32 + 1;
      uVar7 = uVar11 << (uVar5 & 0x3f);
      to_decode = to_decode - 1;
      uVar6 = local_270.buff_btg;
    } while (to_decode != 0);
  }
  free(A);
  return;
}

Assistant:

void shuff_decompress(
    uint32_t* out_u32, size_t to_decode, const uint8_t* in_u8, size_t cSrcSize)
{
    bit_io_t bio;
    SHUFF_START_INPUT(&bio, in_u8);
    uint64_t* mapping
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL);
    uint64_t cw_lens[SHUFF_L + 1];

    uint64_t n = SHUFF_INPUT_ULONG(&bio, SHUFF_LOG2_MAX_SYMBOL);
    int64_t* lens = (int64_t*)shuff_allocate(sizeof(int64_t) * n + 1);

    uint64_t max_cw_len = SHUFF_INPUT_ULONG(&bio, SHUFF_LOG2_L);

    for (int i = 0; i <= (int)max_cw_len; i++)
        cw_lens[i] = 0;
    for (int64_t* p = lens; p < lens + n; p++) {
        *p = max_cw_len - SHUFF_INPUT_UNARY_CODE(&bio);
        cw_lens[*p]++;
    }

    uint64_t min_cw_len = 0;
    for (min_cw_len = 0; cw_lens[min_cw_len] == 0; min_cw_len++)
        ;

    shuff_build_canonical_arrays(cw_lens, max_cw_len);

    shuff_interp_decode(&bio, mapping, n);

    for (int i = 1; i <= (int64_t)max_cw_len; i++)
        cw_lens[i] += cw_lens[i - 1];

    for (int64_t* p = lens + n - 1; p >= lens; p--)
        *p = cw_lens[*p - 1]++;

    uint64_t t, from, S;
    int64_t start = 0;
    lens[n] = 1; // sentinel
    while (start < n) {
        from = start;
        S = mapping[start];

        while (lens[from] >= 0) {
            int i = lens[from];
            lens[from] = -1;
            t = mapping[i];
            mapping[i] = S;
            S = t;
            from = i;
        }

        while (lens[start] == -1)
            start++; // find next start (if any)
    }
    free(lens);

    shuff_build_lut(max_cw_len);

    uint64_t code = 0;
    uint64_t bits_needed = sizeof(uint64_t) << 3;
    uint64_t currcode;
    uint64_t currlen = sizeof(uint64_t) << 3;
    uint64_t* lj;
    uint64_t* start_linear_search
        = shuff_lj_base + SHUFF_MAX(SHUFF_LUT_BITS, min_cw_len) - 1;

    while (to_decode != 0) {
        code |= SHUFF_INPUT_ULONG(&bio, bits_needed);

        lj = shuff_lut[code >> ((sizeof(uint64_t) << 3) - SHUFF_LUT_BITS)];
        if (lj == NULL)
            for (lj = start_linear_search; code < *lj; lj++)
                ;
        currlen = lj - shuff_lj_base + 1;

        // calculate symbol number
        currcode = code >> ((sizeof(uint64_t) << 3) - currlen);
        currcode -= shuff_min_code[currlen - 1];
        currcode += shuff_offset[currlen - 1];

        // subtract the one added in encoding
        *out_u32++ = mapping[currcode] - 1; // we add 1 to everything we encode

        code <<= currlen;
        bits_needed = currlen;
        to_decode--;
    }

    free(mapping);
}